

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iob.c
# Opt level: O0

int tnt_iob_init(tnt_iob *iob,size_t size,tnt_iob_tx_t tx,tnt_iob_txv_t txv,void *ptr)

{
  char *pcVar1;
  void *ptr_local;
  tnt_iob_txv_t txv_local;
  tnt_iob_tx_t tx_local;
  size_t size_local;
  tnt_iob *iob_local;
  
  iob->tx = tx;
  iob->txv = txv;
  iob->ptr = ptr;
  iob->size = size;
  iob->off = 0;
  iob->top = 0;
  iob->buf = (char *)0x0;
  if (size != 0) {
    pcVar1 = (char *)tnt_mem_alloc(size);
    iob->buf = pcVar1;
    if (iob->buf == (char *)0x0) {
      return -1;
    }
    memset(iob->buf,0,size);
  }
  return 0;
}

Assistant:

int
tnt_iob_init(struct tnt_iob *iob, size_t size,
	     tnt_iob_tx_t tx,
	     tnt_iob_txv_t txv, void *ptr)
{
	iob->tx = tx;
	iob->txv = txv;
	iob->ptr = ptr;
	iob->size = size;
	iob->off = 0;
	iob->top = 0;
	iob->buf = NULL;
	if (size > 0) {
		iob->buf = tnt_mem_alloc(size);
		if (iob->buf == NULL)
			return -1;
		memset(iob->buf, 0, size);
	}
	return 0;
}